

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O3

void __thiscall cmUVJobServerClient::Impl::ReceivedToken(Impl *this)

{
  DecrementNeedTokens(this);
  this->HeldTokens = this->HeldTokens + 1;
  if ((this->OnToken).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->OnToken)._M_invoker)((_Any_data *)&this->OnToken);
    return;
  }
  ReleaseToken(this);
  return;
}

Assistant:

void cmUVJobServerClient::Impl::ReceivedToken()
{
  this->DecrementNeedTokens();
  this->HoldToken();
}